

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

bool __thiscall
QGraphicsViewPrivate::updateRegion(QGraphicsViewPrivate *this,QRectF *rect,QTransform *xform)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  undefined8 *puVar4;
  QRect *in_RDX;
  QRectF *in_RSI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  const_iterator __end1;
  const_iterator __begin1;
  QRegion *__range1;
  bool dontAdjustForAntialiasing;
  QRect viewRect_1;
  QRect viewRect;
  QRegion region;
  int in_stack_ffffffffffffff38;
  OptimizationFlag in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  QRectF *in_stack_ffffffffffffff48;
  int dx1;
  undefined8 *local_a0;
  bool local_6d;
  undefined8 local_6c;
  undefined8 local_64;
  QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4> local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  QRegion local_38;
  QRegion local_30;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QRectF::isEmpty(in_RSI);
  if (bVar1) {
    local_6d = false;
  }
  else if ((in_RDI->viewportUpdateMode == MinimalViewportUpdate) ||
          (in_RDI->viewportUpdateMode == SmartViewportUpdate)) {
    local_30.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = QRectF::toAlignedRect();
    QRegion::QRegion(&local_38,(QRect *)local_48,Rectangle);
    QTransform::map((QRegion *)&local_30);
    QRegion::~QRegion(&local_38);
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = QRegion::boundingRect();
    local_5c.super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i =
         (QFlagsStorage<QGraphicsView::OptimizationFlag>)
         QFlags<QGraphicsView::OptimizationFlag>::operator&
                   ((QFlags<QGraphicsView::OptimizationFlag> *)
                    CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    in_stack_ffffffffffffff3c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_5c);
    iVar3 = (int)((ulong)in_RDX >> 0x20);
    if (IVar2 == 0) {
      QRect::adjust((QRect *)in_RDI,iVar3,(int)in_RDX,in_stack_ffffffffffffff44,
                    in_stack_ffffffffffffff40);
    }
    else {
      QRect::adjust((QRect *)in_RDI,iVar3,(int)in_RDX,in_stack_ffffffffffffff44,
                    in_stack_ffffffffffffff40);
    }
    iVar3 = QWidget::width((QWidget *)0xa363bd);
    QWidget::height((QWidget *)0xa363d4);
    bVar1 = intersectsViewport((QRect *)CONCAT44(iVar3,in_stack_ffffffffffffff40),
                               in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    if (bVar1) {
      local_a0 = (undefined8 *)QRegion::begin();
      puVar4 = (undefined8 *)QRegion::end();
      for (; local_a0 != puVar4; local_a0 = local_a0 + 2) {
        local_6c = *local_a0;
        local_64 = local_a0[1];
        dx1 = (int)((ulong)in_RDX >> 0x20);
        if (IVar2 == 0) {
          QRect::adjust((QRect *)in_RDI,dx1,(int)in_RDX,iVar3,in_stack_ffffffffffffff40);
        }
        else {
          QRect::adjust((QRect *)in_RDI,dx1,(int)in_RDX,iVar3,in_stack_ffffffffffffff40);
        }
        if ((*(uint *)&in_RDI->field_0x300 >> 0xd & 1) != 0) {
          QRect::operator&=(in_RDX,(QRect *)CONCAT44(iVar3,in_stack_ffffffffffffff40));
        }
        QRegion::operator+=(&in_RDI->dirtyRegion,(QRect *)&local_6c);
      }
      local_6d = true;
    }
    else {
      local_6d = false;
    }
    QRegion::~QRegion(&local_30);
  }
  else {
    QTransform::mapRect((QRectF *)local_28);
    local_6d = updateRectF(in_RDI,in_stack_ffffffffffffff48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_6d;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsViewPrivate::updateRegion(const QRectF &rect, const QTransform &xform)
{
    if (rect.isEmpty())
        return false;

    if (viewportUpdateMode != QGraphicsView::MinimalViewportUpdate
        && viewportUpdateMode != QGraphicsView::SmartViewportUpdate) {
        // No point in updating with QRegion granularity; use the rect instead.
        return updateRectF(xform.mapRect(rect));
    }

    // Update mode is either Minimal or Smart, so we have to do a potentially slow operation,
    // which is clearly documented here: QGraphicsItem::setBoundingRegionGranularity.
    const QRegion region = xform.map(QRegion(rect.toAlignedRect()));
    QRect viewRect = region.boundingRect();
    const bool dontAdjustForAntialiasing = optimizationFlags & QGraphicsView::DontAdjustForAntialiasing;
    if (dontAdjustForAntialiasing)
        viewRect.adjust(-1, -1, 1, 1);
    else
        viewRect.adjust(-2, -2, 2, 2);
    if (!intersectsViewport(viewRect, viewport->width(), viewport->height()))
        return false; // Update region for sure outside viewport.

    for (QRect viewRect : region) {
        if (dontAdjustForAntialiasing)
            viewRect.adjust(-1, -1, 1, 1);
        else
            viewRect.adjust(-2, -2, 2, 2);
        if (hasUpdateClip)
            viewRect &= updateClip;
        dirtyRegion += viewRect;
    }

    return true;
}